

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O3

void embree::emitXML(FileName *fileName,Ref<embree::XML> *xml)

{
  pointer pcVar1;
  char cVar2;
  runtime_error *this;
  long *plVar3;
  long *plVar4;
  ofstream cout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,(fileName->filename)._M_dataplus._M_p,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    emitXML((ostream *)&local_228,xml,0);
    std::ofstream::close();
    local_228 = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _XrmGetResource;
    std::filebuf::~filebuf(local_220);
    std::ios_base::~ios_base(local_130);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  pcVar1 = (fileName->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar1,pcVar1 + (fileName->filename)._M_string_length);
  std::operator+(&local_248,"cannot open file ",&local_288);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_268 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_268 == plVar4) {
    local_258 = *plVar4;
    lStack_250 = plVar3[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *plVar4;
  }
  local_260 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_268);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void emitXML(const FileName& fileName, const Ref<XML>& xml)
  {
    std::ofstream cout(fileName.c_str());
    if (!cout.is_open()) THROW_RUNTIME_ERROR("cannot open file " + fileName.str() + " for writing");
    emitXML(cout,xml);
    cout.close();
  }